

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week5-app1.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  Vector<int> v_int;
  Vector<Date> v;
  Date d3;
  Date d2;
  Date d1;
  
  d1.year = 0x7dc;
  d1.month = 0;
  d1.day = 0;
  d2.year = 0x7e4;
  d2.month = 7;
  d2.day = 0;
  d3.year = 0x7e4;
  d3.month = 10;
  d3.day = 0x1e;
  print(&d1);
  print(&d2);
  print(&d3);
  Vector<Date>::Vector(&v,3);
  print<Date>(&v);
  (v.values)->day = d1.day;
  (v.values)->year = d1.year;
  (v.values)->month = d1.month;
  v.values[1].day = d2.day;
  v.values[1].year = d2.year;
  v.values[1].month = d2.month;
  v.values[2].day = d3.day;
  v.values[2].year = d3.year;
  v.values[2].month = d3.month;
  print<Date>(&v);
  Vector<int>::Vector(&v_int,3);
  lVar1 = 0;
  while (lVar1 != 3) {
    v_int.values[lVar1] = (int)(lVar1 + 1);
    lVar1 = lVar1 + 1;
  }
  print<int>(&v_int);
  Vector<int>::~Vector(&v_int);
  Vector<Date>::~Vector(&v);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    auto d1 = Date(2012);
    auto d2 = Date(2020, 7);
    auto d3 = Date(2020, 10, 30);
    print(d1);
    print(d2);
    print(d3);

    auto v = Vector<Date>(3);
    print(v);
    v.set(0, d1);
    v.set(1, d2);
    v.set(2, d3);
    print(v);

    auto v_int = Vector<int>(3);
    for(int i=0; i<3; ++i)
        v_int.set(i, i+1);
    print(v_int);

    return 0;
}